

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

pair<const_spvtools::val::BasicBlock_*,_bool> __thiscall
spvtools::val::Function::GetBlock(Function *this,uint32_t block_id)

{
  const_iterator cVar1;
  const_iterator cVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  BasicBlock *pBVar4;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar5;
  key_type_conflict local_18;
  uint32_t local_14;
  
  local_14 = block_id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->blocks_)._M_h,&local_14);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
      _M_cur == (__node_type *)0x0) {
    pBVar4 = (BasicBlock *)0x0;
    uVar3 = 0;
  }
  else {
    pBVar4 = (BasicBlock *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                    ._M_cur + 0x10);
    _local_18 = CONCAT44(local_14,*(undefined4 *)
                                   ((long)cVar1.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                                          ._M_cur + 0x10));
    cVar2 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->undefined_blocks_)._M_h,&local_18);
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),
                     cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                     (__node_type *)0x0);
  }
  pVar5._8_8_ = uVar3;
  pVar5.first = pBVar4;
  return pVar5;
}

Assistant:

std::pair<const BasicBlock*, bool> Function::GetBlock(uint32_t block_id) const {
  const auto b = blocks_.find(block_id);
  if (b != end(blocks_)) {
    const BasicBlock* block = &(b->second);
    bool defined =
        undefined_blocks_.find(block->id()) == std::end(undefined_blocks_);
    return std::make_pair(block, defined);
  } else {
    return std::make_pair(nullptr, false);
  }
}